

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void lyxp_expr_free(lyxp_expr *expr)

{
  ulong uVar1;
  
  if (expr != (lyxp_expr *)0x0) {
    free(expr->expr);
    free(expr->tokens);
    free(expr->expr_pos);
    free(expr->tok_len);
    if ((expr->repeat != (lyxp_expr_type **)0x0) && (expr->used != 0)) {
      uVar1 = 0;
      do {
        free(expr->repeat[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < expr->used);
    }
    free(expr->repeat);
    free(expr);
    return;
  }
  return;
}

Assistant:

void
lyxp_expr_free(struct lyxp_expr *expr)
{
    uint16_t i;

    if (!expr) {
        return;
    }

    free(expr->expr);
    free(expr->tokens);
    free(expr->expr_pos);
    free(expr->tok_len);
    if (expr->repeat) {
        for (i = 0; i < expr->used; ++i) {
            free(expr->repeat[i]);
        }
    }
    free(expr->repeat);
    free(expr);
}